

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_stream.cpp
# Opt level: O3

ssize_t __thiscall
dap::ContentReader::read_abi_cxx11_(ContentReader *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  undefined4 in_register_00000034;
  ContentReader *this_00;
  size_t sVar4;
  size_t bytes;
  
  this_00 = (ContentReader *)CONCAT44(in_register_00000034,__fd);
  if (this_00->on_invalid_data == kClose) {
    bVar1 = match(this_00,(uint8_t *)"Content-Length:",0xf);
    if (!bVar1) goto LAB_0086030c;
LAB_00860224:
    do {
      cVar2 = matchAny(this_00," \t");
    } while (cVar2 != '\0');
    cVar2 = matchAny(this_00,"0123456789");
    if (cVar2 != '\0') {
      bytes = 0;
      do {
        sVar4 = bytes;
        lVar3 = (long)cVar2;
        bytes = sVar4 * 10 + -0x30 + lVar3;
        cVar2 = matchAny(this_00,"0123456789");
      } while (cVar2 != '\0');
      if (bytes != 0) {
        bVar1 = match(this_00,"\r\n\r\n",4);
        if (!bVar1) {
LAB_0086030c:
          badHeader_abi_cxx11_((string *)this,this_00);
          return (ssize_t)this;
        }
        bVar1 = buffer(this_00,bytes);
        (this->reader).super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&this->buf;
        if (bVar1) {
          (this->reader).super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          *(undefined1 *)
           &(this->buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Deque_impl_data._M_map = 0;
          std::__cxx11::string::reserve((ulong)this);
          lVar3 = sVar4 * 10 + -0x30 + lVar3;
          do {
            std::__cxx11::string::push_back((char)this);
            std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(&this_00->buf);
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
          return (ssize_t)this;
        }
        goto LAB_008602f8;
      }
    }
  }
  else {
    bVar1 = scan(this_00,(uint8_t *)"Content-Length:",0xf);
    if (bVar1) goto LAB_00860224;
  }
  (this->reader).super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&this->buf;
LAB_008602f8:
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"");
  return (ssize_t)this;
}

Assistant:

std::string ContentReader::read() {
  // Find Content-Length header prefix
  if (on_invalid_data == kClose) {
    if (!match("Content-Length:")) {
      return badHeader();
    }
  } else {
    if (!scan("Content-Length:")) {
      return "";
    }
  }
  // Skip whitespace and tabs
  while (matchAny(" \t")) {
  }
  // Parse length
  size_t len = 0;
  while (true) {
    auto c = matchAny("0123456789");
    if (c == 0) {
      break;
    }
    len *= 10;
    len += size_t(c) - size_t('0');
  }
  if (len == 0) {
    return "";
  }

  // Expect \r\n\r\n
  if (!match("\r\n\r\n")) {
    return badHeader();
  }

  // Read message
  if (!buffer(len)) {
    return "";
  }
  std::string out;
  out.reserve(len);
  for (size_t i = 0; i < len; i++) {
    out.push_back(static_cast<char>(buf.front()));
    buf.pop_front();
  }
  return out;
}